

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<fujita>::RegisterTests
          (ParameterizedTestSuiteInfo<fujita> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Alloc_hider name;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer pIVar9;
  undefined4 extraout_var;
  long *plVar11;
  testing *this_00;
  ostream *poVar12;
  size_t sVar13;
  const_iterator cVar14;
  long *plVar15;
  char *pcVar16;
  undefined4 extraout_var_01;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_02;
  pair<double,_float> *value;
  pointer local_1a0;
  string local_198;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_type local_108;
  string test_name;
  string local_e0;
  ParamGenerator<std::pair<double,_float>_> generator;
  CodeLocation local_b0;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  ParameterizedTestSuiteInfo<fujita> *local_70;
  code *local_68;
  char *local_60;
  CodeLocation local_58;
  long *plVar10;
  undefined4 extraout_var_00;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  local_1a0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a0 != local_88) {
    bVar6 = false;
    local_70 = this;
    do {
      pIVar9 = (this->instantiations_).
               super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<fujita>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<fujita>::InstantiationInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_80 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<fujita>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<fujita>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar9 != local_80) {
        do {
          (*(code *)pIVar9->generator)(&generator);
          sVar2 = (pIVar9->name)._M_string_length;
          local_68 = (code *)pIVar9->name_func;
          __s = pIVar9->file;
          iVar8 = pIVar9->line;
          local_78 = pIVar9;
          if (sVar2 == 0) {
            test_suite_name._M_string_length = 0;
            *test_suite_name._M_dataplus._M_p = '\0';
          }
          else {
            test_param_names._M_t._M_impl._0_8_ =
                 &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (pIVar9->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&test_param_names,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)&test_param_names);
            std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
            if ((_Base_ptr *)test_param_names._M_t._M_impl._0_8_ !=
                &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)test_param_names._M_t._M_impl._0_8_,
                              (ulong)((long)&(test_param_names._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&test_suite_name,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar7 = (*(generator.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::pair<double,_float>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
          plVar10 = (long *)CONCAT44(extraout_var,iVar7);
          iVar7 = (*(generator.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::pair<double,_float>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
          plVar11 = (long *)CONCAT44(extraout_var_00,iVar7);
          if (plVar10 != plVar11) {
            local_108 = 0;
            while( true ) {
              cVar5 = (**(code **)(*plVar10 + 0x30))(plVar10,plVar11);
              if (cVar5 != '\0') break;
              this_00 = (testing *)(**(code **)(*plVar10 + 0x28))(plVar10);
              test_name._M_string_length = 0;
              *test_name._M_dataplus._M_p = '\0';
              local_198._M_dataplus._M_p._0_4_ = *(undefined4 *)this_00;
              local_198._M_dataplus._M_p._4_4_ = *(undefined4 *)(this_00 + 4);
              local_198._M_string_length._0_4_ = *(undefined4 *)(this_00 + 8);
              local_198._M_string_length._4_4_ = *(undefined4 *)(this_00 + 0xc);
              local_198.field_2._M_allocated_capacity = local_108;
              (*local_68)(&param_name,&local_198);
              bVar6 = IsValidParamName(&param_name);
              bVar6 = IsTrue(bVar6);
              if (!bVar6) {
                GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                     param_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," line ",6);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_198);
              }
              cVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&test_param_names,&param_name);
              bVar6 = IsTrue((_Rb_tree_header *)cVar14._M_node ==
                             &test_param_names._M_t._M_impl.super__Rb_tree_header);
              if (!bVar6) {
                GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                     param_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," line ",6);
                plVar15 = (long *)std::ostream::operator<<((ostream *)poVar12,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
                std::ostream::put((char)plVar15);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_198);
              }
              peVar4 = (local_1a0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar16 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&test_name,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar16);
              }
              std::__cxx11::string::_M_append((char *)&test_name,(ulong)param_name._M_dataplus._M_p)
              ;
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&test_param_names,&param_name);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,test_suite_name._M_dataplus._M_p,
                         test_suite_name._M_dataplus._M_p + test_suite_name._M_string_length);
              name = test_name._M_dataplus;
              PrintToString<std::pair<double,float>>(&local_198,this_00,value);
              pcVar16 = (char *)CONCAT44(local_198._M_dataplus._M_p._4_4_,
                                         local_198._M_dataplus._M_p._0_4_);
              peVar4 = (local_1a0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_b0.line = (peVar4->code_location).line;
              local_60 = pcVar16;
              iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])(this);
              set_up_tc = SuiteApiResolver<fujita>::GetSetUpCaseOrSuite(__s,iVar8);
              tear_down_tc = SuiteApiResolver<fujita>::GetTearDownCaseOrSuite(__s,iVar8);
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)(((local_1a0->
                                                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->test_meta_factory)._M_t.
                                              super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::pair<double,_float>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::pair<double,_float>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::pair<double,_float>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::pair<double,_float>_>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::pair<double,_float>_>_*,_false>
                                    + 0x10))
                                  ((int)*(undefined8 *)this_00,*(undefined4 *)(this_00 + 8));
              MakeAndRegisterTestInfo
                        (&local_e0,name._M_p,(char *)0x0,local_60,&local_b0,
                         (TypeId)CONCAT44(extraout_var_01,iVar7),set_up_tc,tear_down_tc,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
                operator_delete(local_b0.file._M_dataplus._M_p,
                                local_b0.file.field_2._M_allocated_capacity + 1);
              }
              this = local_70;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_) !=
                  &local_198.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_198._M_dataplus._M_p._4_4_,
                                         local_198._M_dataplus._M_p._0_4_),
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)param_name._M_dataplus._M_p != &param_name.field_2) {
                operator_delete(param_name._M_dataplus._M_p,
                                param_name.field_2._M_allocated_capacity + 1);
              }
              local_108 = local_108 + 1;
              bVar6 = true;
              (**(code **)(*plVar10 + 0x18))(plVar10);
            }
          }
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 8))(plVar11);
          }
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 8))(plVar10);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&test_param_names._M_t);
          if (generator.impl_.
              super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::pair<double,_float>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::pair<double,_float>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pIVar9 = local_78 + 1;
        } while (pIVar9 != local_80);
      }
      local_1a0 = local_1a0 + 1;
    } while (local_1a0 != local_88);
    if (bVar6) goto LAB_00140bf9;
  }
  iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                    (this);
  paVar1 = &local_58.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_02,iVar8),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<fujita>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_00140bf9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name._M_dataplus._M_p != &test_name.field_2) {
    operator_delete(test_name._M_dataplus._M_p,
                    CONCAT71(test_name.field_2._M_allocated_capacity._1_7_,
                             test_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_suite_name._M_dataplus._M_p != &test_suite_name.field_2) {
    operator_delete(test_suite_name._M_dataplus._M_p,
                    CONCAT71(test_suite_name.field_2._M_allocated_capacity._1_7_,
                             test_suite_name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }